

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O0

size_t __thiscall
helics::ActionMessage::from_vector(ActionMessage *this,vector<char,_std::allocator<char>_> *data)

{
  bool bVar1;
  const_reference pvVar2;
  char *__str;
  size_type __len;
  vector<char,_std::allocator<char>_> *in_RSI;
  vector<char,_std::allocator<char>_> *in_RDI;
  size_t bytesUsed;
  ActionMessage *in_stack_00000040;
  ActionMessage *in_stack_00000258;
  string_view in_stack_00000260;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  size_t local_8;
  
  std::vector<char,_std::allocator<char>_>::data((vector<char,_std::allocator<char>_> *)0x52c602);
  CLI::std::vector<char,_std::allocator<char>_>::size(in_RSI);
  local_8 = fromByteArray(in_stack_00000040,(byte *)this,(size_t)data);
  if (((local_8 == 0) &&
      (bVar1 = std::vector<char,_std::allocator<char>_>::empty(in_stack_ffffffffffffffd0), !bVar1))
     && (pvVar2 = std::vector<char,_std::allocator<char>_>::front(in_RDI), *pvVar2 == '{')) {
    __str = std::vector<char,_std::allocator<char>_>::data
                      ((vector<char,_std::allocator<char>_> *)0x52c65a);
    __len = CLI::std::vector<char,_std::allocator<char>_>::size(in_RSI);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffd0,__str,
               __len);
    bVar1 = from_json_string(in_stack_00000258,in_stack_00000260);
    if (bVar1) {
      local_8 = CLI::std::vector<char,_std::allocator<char>_>::size(in_RSI);
    }
  }
  return local_8;
}

Assistant:

std::size_t ActionMessage::from_vector(const std::vector<char>& data)
{
    const std::size_t bytesUsed =
        fromByteArray(reinterpret_cast<const std::byte*>(data.data()), data.size());
    if (bytesUsed == 0 && !data.empty() && data.front() == '{') {
        if (from_json_string(std::string_view(data.data(), data.size()))) {
            return data.size();
        }
    }
    return bytesUsed;
}